

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O3

void icu_63::initAvailableMetaZoneIDs(void)

{
  UBool UVar1;
  UVector *this;
  UResourceBundle *resB;
  char *__s;
  size_t sVar2;
  UChar *us;
  UnicodeString *this_00;
  void *pvVar3;
  code *size;
  UChar *size_00;
  UErrorCode status;
  UResourceBundle res;
  UErrorCode local_104;
  UResourceBundle *local_100;
  UResourceBundle local_f8;
  
  ucln_i18n_registerCleanup_63(UCLN_I18N_ZONEMETA,zoneMeta_cleanup);
  local_104 = U_ZERO_ERROR;
  gMetaZoneIDTable =
       uhash_open_63(uhash_hashUnicodeString_63,uhash_compareUnicodeString_63,(undefined1 *)0x0,
                     &local_104);
  if (gMetaZoneIDTable == (UHashtable *)0x0 || U_ZERO_ERROR < local_104) {
    gMetaZoneIDTable = (UHashtable *)0x0;
  }
  else {
    size = uprv_deleteUObject_63;
    uhash_setKeyDeleter_63(gMetaZoneIDTable,uprv_deleteUObject_63);
    this = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
    if ((this == (UVector *)0x0) ||
       (UVector::UVector(this,(UObjectDeleter *)0x0,uhash_compareUChars_63,&local_104),
       U_ZERO_ERROR < local_104)) {
      gMetaZoneIDs = (UVector *)0x0;
      uhash_close_63(gMetaZoneIDTable);
      gMetaZoneIDTable = (UHashtable *)0x0;
    }
    else {
      gMetaZoneIDs = this;
      UVector::setDeleter(this,uprv_free_63);
      local_100 = ures_openDirect_63((char *)0x0,"metaZones",&local_104);
      resB = ures_getByKey_63(local_100,"mapTimezones",(UResourceBundle *)0x0,&local_104);
      ures_initStackObject_63(&local_f8);
      if (local_104 < U_ILLEGAL_ARGUMENT_ERROR) {
        do {
          UVar1 = ures_hasNext_63(resB);
          if ((UVar1 == '\0') ||
             (ures_getNextResource_63(resB,&local_f8,&local_104), U_ZERO_ERROR < local_104)) break;
          __s = ures_getKey_63(&local_f8);
          sVar2 = strlen(__s);
          us = (UChar *)uprv_malloc_63((long)((sVar2 << 0x20) + 0x100000000) >> 0x1f);
          if (us == (UChar *)0x0) {
            local_104 = U_MEMORY_ALLOCATION_ERROR;
            break;
          }
          size_00 = us;
          u_charsToUChars_63(__s,us,(int32_t)sVar2);
          *(undefined2 *)((long)us + ((long)(sVar2 << 0x20) >> 0x1f)) = 0;
          this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)size_00);
          if (this_00 != (UnicodeString *)0x0) {
            UnicodeString::UnicodeString(this_00,us);
          }
          pvVar3 = uhash_get_63(gMetaZoneIDTable,this_00);
          if (pvVar3 == (void *)0x0) {
            UVector::addElement(gMetaZoneIDs,us,&local_104);
            uhash_put_63(gMetaZoneIDTable,this_00,us,&local_104);
          }
          else {
            uprv_free_63(us);
            if (this_00 != (UnicodeString *)0x0) {
              (*(this_00->super_Replaceable).super_UObject._vptr_UObject[1])(this_00);
            }
          }
        } while (local_104 < U_ILLEGAL_ARGUMENT_ERROR);
      }
      ures_close_63(&local_f8);
      ures_close_63(resB);
      ures_close_63(local_100);
      if (U_ZERO_ERROR < local_104) {
        uhash_close_63(gMetaZoneIDTable);
        if (gMetaZoneIDs != (UVector *)0x0) {
          (*(gMetaZoneIDs->super_UObject)._vptr_UObject[1])();
        }
        gMetaZoneIDTable = (UHashtable *)0x0;
        gMetaZoneIDs = (UVector *)0x0;
      }
    }
  }
  return;
}

Assistant:

static void U_CALLCONV initAvailableMetaZoneIDs () {
    U_ASSERT(gMetaZoneIDs == NULL);
    U_ASSERT(gMetaZoneIDTable == NULL);
    ucln_i18n_registerCleanup(UCLN_I18N_ZONEMETA, zoneMeta_cleanup);

    UErrorCode status = U_ZERO_ERROR;
    gMetaZoneIDTable = uhash_open(uhash_hashUnicodeString, uhash_compareUnicodeString, NULL, &status);
    if (U_FAILURE(status) || gMetaZoneIDTable == NULL) {
        gMetaZoneIDTable = NULL;
        return;
    }
    uhash_setKeyDeleter(gMetaZoneIDTable, uprv_deleteUObject);
    // No valueDeleter, because the vector maintain the value objects
    gMetaZoneIDs = new UVector(NULL, uhash_compareUChars, status);
    if (U_FAILURE(status) || gMetaZoneIDs == NULL) {
        gMetaZoneIDs = NULL;
        uhash_close(gMetaZoneIDTable);
        gMetaZoneIDTable = NULL;
        return;
    }
    gMetaZoneIDs->setDeleter(uprv_free);

    UResourceBundle *rb = ures_openDirect(NULL, gMetaZones, &status);
    UResourceBundle *bundle = ures_getByKey(rb, gMapTimezonesTag, NULL, &status);
    UResourceBundle res;
    ures_initStackObject(&res);
    while (U_SUCCESS(status) && ures_hasNext(bundle)) {
        ures_getNextResource(bundle, &res, &status);
        if (U_FAILURE(status)) {
            break;
        }
        const char *mzID = ures_getKey(&res);
        int32_t len = static_cast<int32_t>(uprv_strlen(mzID));
        UChar *uMzID = (UChar*)uprv_malloc(sizeof(UChar) * (len + 1));
        if (uMzID == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            break;
        }
        u_charsToUChars(mzID, uMzID, len);
        uMzID[len] = 0;
        UnicodeString *usMzID = new UnicodeString(uMzID);
        if (uhash_get(gMetaZoneIDTable, usMzID) == NULL) {
            gMetaZoneIDs->addElement((void *)uMzID, status);
            uhash_put(gMetaZoneIDTable, (void *)usMzID, (void *)uMzID, &status);
        } else {
            uprv_free(uMzID);
            delete usMzID;
        }
    }
    ures_close(&res);
    ures_close(bundle);
    ures_close(rb);

    if (U_FAILURE(status)) {
        uhash_close(gMetaZoneIDTable);
        delete gMetaZoneIDs;
        gMetaZoneIDTable = NULL;
        gMetaZoneIDs = NULL;
    }
}